

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O0

void __thiscall Image::Image(Image *this,string *filename)

{
  undefined1 uVar1;
  undefined1 uVar2;
  bool bVar3;
  int *height;
  float *pfVar4;
  undefined8 *puVar5;
  float **in_RDI;
  int n;
  string ext;
  char *in_stack_ffffffffffffff88;
  undefined5 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff95;
  undefined1 in_stack_ffffffffffffff96;
  undefined1 in_stack_ffffffffffffff97;
  char (*in_stack_ffffffffffffff98) [15];
  float **filename_00;
  int req_comp;
  ConsoleLogger *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffa8;
  string *in_stack_ffffffffffffffb8;
  string local_30 [48];
  
  suffix(in_stack_ffffffffffffffb8);
  github111116::ConsoleLogger::log<char[15],std::__cxx11::string>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff97,
                      CONCAT16(in_stack_ffffffffffffff96,
                               CONCAT15(in_stack_ffffffffffffff95,in_stack_ffffffffffffff90))));
  req_comp = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  uVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffff97,
                                   CONCAT16(in_stack_ffffffffffffff96,
                                            CONCAT15(in_stack_ffffffffffffff95,
                                                     in_stack_ffffffffffffff90))),
                          in_stack_ffffffffffffff88);
  if ((bool)uVar1) {
    filename_00 = in_RDI + 1;
    height = (int *)((long)in_RDI + 0xc);
    std::__cxx11::string::c_str();
    LoadEXR_RGB(in_RDI,(int *)CONCAT17(uVar1,in_stack_ffffffffffffffa8),height,(char *)filename_00);
  }
  else {
    uVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_ffffffffffffff97,
                                     CONCAT16(in_stack_ffffffffffffff96,
                                              CONCAT15(in_stack_ffffffffffffff95,
                                                       in_stack_ffffffffffffff90))),
                            in_stack_ffffffffffffff88);
    if (!(bool)uVar2) {
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffff96,
                                                      CONCAT15(in_stack_ffffffffffffff95,
                                                               in_stack_ffffffffffffff90))),
                              in_stack_ffffffffffffff88);
      if (!bVar3) {
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(uVar2,CONCAT16(bVar3,CONCAT15(in_stack_ffffffffffffff95,
                                                                        in_stack_ffffffffffffff90)))
                                ,in_stack_ffffffffffffff88);
        if (!bVar3) {
          puVar5 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar5 = "Image load: unrecognized format";
          __cxa_throw(puVar5,&char_const*::typeinfo,0);
        }
      }
    }
    std::__cxx11::string::c_str();
    pfVar4 = stbi_loadf((char *)in_stack_ffffffffffffffb8,(int *)in_RDI,
                        (int *)CONCAT17(uVar1,in_stack_ffffffffffffffa8),
                        (int *)in_stack_ffffffffffffffa0,req_comp);
    *in_RDI = pfVar4;
  }
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

Image(const std::string& filename) {
		std::string ext = suffix(filename);
		console.log("Loading image:", filename);
		if (ext == "exr") {
			LoadEXR_RGB(&pixels, &w, &h, filename.c_str());
			return;
		}
		if (ext == "hdr" || ext == "png" || ext == "jpg") {
			int n;
			pixels = stbi_loadf(filename.c_str(), &w, &h, &n, 3);
			return;
		}
		throw "Image load: unrecognized format";
	}